

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::ShaderPerformanceCase::iterate(ShaderPerformanceCase *this)

{
  bool bVar1;
  int iVar2;
  TestLog *log;
  InitialCalibration *pIVar3;
  Result RVar4;
  float fStack_1c;
  Result result;
  ShaderPerformanceCase *this_local;
  
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar1) {
    ShaderPerformanceMeasurer::iterate(&this->m_measurer);
    bVar1 = ShaderPerformanceMeasurer::isFinished(&this->m_measurer);
    if (bVar1) {
      log = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      ShaderPerformanceMeasurer::logMeasurementInfo(&this->m_measurer,log);
      bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_initialCalibration);
      if (bVar1) {
        iVar2 = ShaderPerformanceMeasurer::getFinalCallCount(&this->m_measurer);
        iVar2 = de::max<int>(1,iVar2);
        pIVar3 = de::SharedPtr<deqp::gls::ShaderPerformanceCase::InitialCalibration>::operator->
                           (&this->m_initialCalibration);
        pIVar3->initialNumCalls = iVar2;
      }
      RVar4 = ShaderPerformanceMeasurer::getResult(&this->m_measurer);
      fStack_1c = RVar4.megaFragPerSec;
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                ((ulong)RVar4 & 0xffffffff,fStack_1c);
      this_local._4_4_ = STOP;
    }
    else {
      this_local._4_4_ = CONTINUE;
    }
  }
  else {
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

ShaderPerformanceCase::IterateResult ShaderPerformanceCase::iterate (void)
{
	DE_ASSERT(m_program);

	if (!m_program->isOk()) // This happens when compilation failed in init().
		return STOP;

	m_measurer.iterate();

	if (m_measurer.isFinished())
	{
		m_measurer.logMeasurementInfo(m_testCtx.getLog());

		if (m_initialCalibration)
			m_initialCalibration->initialNumCalls = de::max(1, m_measurer.getFinalCallCount());

		const ShaderPerformanceMeasurer::Result result = m_measurer.getResult();
		reportResult(result.megaVertPerSec, result.megaFragPerSec);
		return STOP;
	}
	else
		return CONTINUE;
}